

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangleShape.cpp
# Opt level: O0

Vector2f __thiscall sf::RectangleShape::getPoint(RectangleShape *this,size_t index)

{
  undefined8 in_RSI;
  long in_RDI;
  Vector2f local_8;
  
  switch(in_RSI) {
  default:
    Vector2<float>::Vector2(&local_8,0.0,0.0);
    break;
  case 1:
    Vector2<float>::Vector2(&local_8,*(float *)(in_RDI + 0x150),0.0);
    break;
  case 2:
    Vector2<float>::Vector2(&local_8,*(float *)(in_RDI + 0x150),*(float *)(in_RDI + 0x154));
    break;
  case 3:
    Vector2<float>::Vector2(&local_8,0.0,*(float *)(in_RDI + 0x154));
  }
  return local_8;
}

Assistant:

Vector2f RectangleShape::getPoint(std::size_t index) const
{
    switch (index)
    {
        default:
        case 0: return Vector2f(0, 0);
        case 1: return Vector2f(m_size.x, 0);
        case 2: return Vector2f(m_size.x, m_size.y);
        case 3: return Vector2f(0, m_size.y);
    }
}